

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O2

size_t readback_bytes(mime_state *state,char *buffer,size_t bufsize,char *bytes,size_t numbytes,
                     char *trail,size_t traillen)

{
  size_t sVar1;
  ulong uVar2;
  ulong uVar3;
  char *__src;
  
  sVar1 = curlx_sotouz(state->offset);
  uVar2 = sVar1 - numbytes;
  if (sVar1 < numbytes) {
    uVar3 = numbytes - sVar1;
    __src = bytes + sVar1;
  }
  else {
    uVar3 = traillen - uVar2;
    if (traillen < uVar2 || uVar3 == 0) {
      return 0;
    }
    __src = trail + uVar2;
  }
  if (uVar3 < bufsize) {
    bufsize = uVar3;
  }
  memcpy(buffer,__src,bufsize);
  state->offset = state->offset + bufsize;
  return bufsize;
}

Assistant:

static size_t readback_bytes(struct mime_state *state,
                             char *buffer, size_t bufsize,
                             const char *bytes, size_t numbytes,
                             const char *trail, size_t traillen)
{
  size_t sz;
  size_t offset = curlx_sotouz(state->offset);

  if(numbytes > offset) {
    sz = numbytes - offset;
    bytes += offset;
  }
  else {
    sz = offset - numbytes;
    if(sz >= traillen)
      return 0;
    bytes = trail + sz;
    sz = traillen - sz;
  }

  if(sz > bufsize)
    sz = bufsize;

  memcpy(buffer, bytes, sz);
  state->offset += sz;
  return sz;
}